

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Generic_Stairs(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  bool bVar1;
  bool res;
  EStair type;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  bVar1 = EV_BuildStairs(arg0,(uint)((arg3 & 1U) == 0),(line_t_conflict *)ln,(double)arg2,
                         (double)arg1 / 8.0,0,arg4,arg3 & 2,0);
  if ((((bVar1) && (ln != (line_t *)0x0)) && ((ln->flags & 0x200) != 0)) && (ln->special == 0xcc)) {
    ln->args[3] = ln->args[3] ^ 1;
  }
  return (int)bVar1;
}

Assistant:

FUNC(LS_Generic_Stairs)
// Generic_Stairs (tag, speed, step, dir/igntxt, reset)
{
	DFloor::EStair type = (arg3 & 1) ? DFloor::buildUp : DFloor::buildDown;
	bool res = EV_BuildStairs (arg0, type, ln,
							   arg2, SPEED(arg1), 0, arg4, arg3 & 2, 0);

	if (res && ln && (ln->flags & ML_REPEAT_SPECIAL) && ln->special == Generic_Stairs)
		// Toggle direction of next activation of repeatable stairs
		ln->args[3] ^= 1;

	return res;
}